

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O3

int loop(uchar *pattern,uchar *string,int maxstars)

{
  undefined1 auVar1 [4];
  short sVar2;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  uchar *puVar9;
  int iVar10;
  bool bVar11;
  uchar *pp;
  uchar charset [271];
  undefined1 local_168 [4];
  short sStack_164;
  undefined2 local_160;
  byte *local_158;
  int local_14c;
  uchar local_148 [91];
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  uchar local_48;
  char local_47 [23];
  
  local_14c = maxstars;
  memset(local_148,0,0x10f);
  do {
    bVar3 = *pattern;
    if (bVar3 < 0x5b) {
      if (bVar3 == 0x3f) {
        if (*string == 0) {
          return 1;
        }
      }
      else {
        if (bVar3 == 0) {
          return (uint)(*string != 0);
        }
        if (bVar3 == 0x2a) {
          if (local_14c == 0) {
            return 1;
          }
          do {
            do {
              bVar3 = pattern[1];
              pattern = pattern + 1;
            } while (bVar3 == 0x2a);
            if (bVar3 == 0) {
              return 0;
            }
            if (bVar3 != 0x3f) {
              if (*string == 0) {
                return 1;
              }
              iVar10 = local_14c + -1;
              do {
                iVar4 = loop(pattern,string,iVar10);
                if (iVar4 == 0) {
                  return 0;
                }
                pbVar5 = string + 1;
                string = string + 1;
              } while (*pbVar5 != 0);
              return 1;
            }
            bVar3 = *string;
            string = string + 1;
          } while (bVar3 != 0);
          return 1;
        }
LAB_0051c5a0:
        if (bVar3 != *string) {
          return 1;
        }
      }
      pattern = pattern + 1;
    }
    else if (bVar3 == 0x5b) {
      local_158 = pattern + 1;
      memset(local_148,0,0x10f);
      bVar3 = pattern[1];
      if (bVar3 == 0) {
        return 1;
      }
      bVar11 = false;
      iVar10 = 0;
      pbVar5 = pattern + 1;
LAB_0051c29c:
      if (iVar10 == 2) {
        if (bVar3 != 0x5d) {
LAB_0051c363:
          local_148[bVar3] = '\x01';
          goto LAB_0051c368;
        }
        goto LAB_0051c5b4;
      }
      if (iVar10 != 1) {
        if (iVar10 != 0) goto LAB_0051c574;
        switch(bVar3) {
        case 0x5b:
          if (pbVar5[1] == 0x3a) {
            local_160 = 0;
            _local_168 = 0;
            local_158 = pbVar5 + 3;
            bVar11 = false;
            lVar7 = 0;
            do {
              bVar3 = local_158[-1];
              if (bVar11) {
                if (bVar3 != 0x5d) break;
                auVar1 = local_168;
                sVar2 = sStack_164;
                pcVar8 = local_47 + 1;
                if (((sStack_164 != 0x74 || local_168 != (undefined1  [4])0x69676964) &&
                    (pcVar8 = local_47,
                    sStack_164 != 0x6d || local_168 != (undefined1  [4])0x756e6c61)) &&
                   (pcVar8 = local_47 + 3,
                   sStack_164 != 0x61 || local_168 != (undefined1  [4])0x68706c61)) {
                  pcVar8 = local_47 + 2;
                  if (((((stack0xfffffffffffffe9b != 0x746967 ||
                          auVar1 != (undefined1  [4])0x67696478) &&
                        (pcVar8 = local_47 + 4,
                        sVar2 != 0x74 || auVar1 != (undefined1  [4])0x6e697270)) &&
                       ((pcVar8 = local_47 + 7,
                        sVar2 != 0x68 || auVar1 != (undefined1  [4])0x70617267 &&
                        ((pcVar8 = local_47 + 8,
                         sVar2 != 0x65 || auVar1 != (undefined1  [4])0x63617073 &&
                         (pcVar8 = local_47 + 5,
                         sVar2 != 0x6b || auVar1 != (undefined1  [4])0x6e616c62)))))) &&
                      (pcVar8 = local_47 + 9, sVar2 != 0x72 || auVar1 != (undefined1  [4])0x65707075
                      )) && (pcVar8 = local_47 + 6,
                            sVar2 != 0x72 || auVar1 != (undefined1  [4])0x65776f6c)) break;
                }
                *pcVar8 = '\x01';
                goto LAB_0051c570;
              }
              if ((byte)(bVar3 + 0x9f) < 0x1a) {
                local_168[lVar7] = bVar3;
                bVar11 = false;
              }
              else {
                bVar11 = true;
                if (bVar3 != 0x3a) break;
              }
              lVar7 = lVar7 + 1;
              local_158 = local_158 + 1;
            } while (lVar7 != 10);
          }
          local_158 = pbVar5 + 1;
          local_ed = 1;
          break;
        case 0x5c:
          local_158 = pbVar5 + 1;
          if (pbVar5[1] == 0) {
            local_ec = 1;
          }
          else {
LAB_0051c3af:
            setcharorrange(&local_158,local_148);
          }
          break;
        case 0x5d:
          if (!bVar11) {
            local_eb = 1;
            local_158 = pbVar5 + 1;
            bVar11 = true;
            iVar10 = 1;
            goto LAB_0051c574;
          }
          goto LAB_0051c5b4;
        case 0x5e:
          goto switchD_0051c2c8_caseD_5e;
        default:
          if (bVar3 != 0x21) goto LAB_0051c3af;
          goto switchD_0051c2c8_caseD_5e;
        }
LAB_0051c570:
        bVar11 = true;
LAB_0051c572:
        iVar10 = 0;
LAB_0051c574:
        bVar3 = *local_158;
        pbVar5 = local_158;
        if (bVar3 == 0) {
          return 1;
        }
        goto LAB_0051c29c;
      }
      if (bVar3 == 0x5b) {
        local_ed = 1;
        local_158 = pbVar5 + 1;
        iVar10 = 2;
        goto LAB_0051c574;
      }
      if (bVar3 != 0x5d) {
        if (4 < (byte)(bVar3 - 9) && 0x5e < (byte)(bVar3 - 0x20)) {
          return 1;
        }
        goto LAB_0051c363;
      }
LAB_0051c5b4:
      bVar3 = *string;
      uVar6 = (ulong)bVar3;
      if (uVar6 == 0) {
        return 1;
      }
      if (local_148[uVar6] == '\0') {
        if (local_47[0] != '\0') {
          if (0x19 < (byte)(bVar3 + 0x9f) && 9 < (byte)(bVar3 - 0x30)) {
LAB_0051c60b:
            bVar3 = bVar3 + 0xbf;
LAB_0051c60d:
            bVar11 = bVar3 < 0x1a;
            goto LAB_0051c612;
          }
          goto LAB_0051c5c8;
        }
        if (local_47[3] != '\0') {
          if (0x19 < (byte)(bVar3 + 0x9f)) goto LAB_0051c60b;
          goto LAB_0051c5c8;
        }
        if (local_47[1] != '\0') {
          bVar11 = (byte)(bVar3 - 0x30) < 10;
          goto LAB_0051c612;
        }
        if (local_47[2] != '\0') {
          if (5 < (byte)(bVar3 + 0x9f) && 9 < (byte)(bVar3 - 0x30)) {
            bVar11 = (byte)(bVar3 + 0xbf) < 6;
            goto LAB_0051c612;
          }
          goto LAB_0051c5c8;
        }
        if (local_47[4] != '\0') {
          if (4 < (byte)(bVar3 - 9)) {
            bVar11 = (byte)(bVar3 - 0x20) < 0x5f;
            goto LAB_0051c612;
          }
          goto LAB_0051c5c8;
        }
        if (local_47[8] != '\0') {
          if ((uVar6 != 9) && (bVar3 != 0x20)) {
            bVar11 = (byte)(bVar3 - 10) < 4;
            goto LAB_0051c612;
          }
          goto LAB_0051c5c8;
        }
        if (local_47[9] != '\0') goto LAB_0051c60b;
        if (local_47[6] != '\0') {
          bVar3 = bVar3 + 0x9f;
          goto LAB_0051c60d;
        }
        if (local_47[5] == '\0') {
          if (local_47[7] != '\0') {
            if ((byte)(bVar3 - 9) < 5) goto LAB_0051c5c8;
            bVar11 = (byte)(bVar3 - 0x21) < 0x5e;
            goto LAB_0051c612;
          }
          if (local_48 == '\0') {
            return 1;
          }
        }
        else {
          bVar11 = uVar6 == 9 || uVar6 == 0x20;
LAB_0051c612:
          if ((bool)(local_48 == '\0' ^ bVar11)) {
            return 1;
          }
        }
      }
      else {
LAB_0051c5c8:
        if (local_48 != '\0') {
          return 1;
        }
      }
      pattern = pbVar5 + 1;
    }
    else {
      if (bVar3 != 0x5c) goto LAB_0051c5a0;
      pbVar5 = pattern + 1;
      bVar3 = pattern[1];
      if (pattern[1] == 0) {
        pbVar5 = pattern;
        bVar3 = 0x5c;
      }
      if (*string != bVar3) {
        return 1;
      }
      pattern = pbVar5 + 1;
    }
    string = string + 1;
  } while( true );
switchD_0051c2c8_caseD_5e:
  if (bVar11) {
    puVar9 = local_148 + bVar3;
  }
  else {
    puVar9 = &local_48;
    if (local_48 != '\0') {
      puVar9 = local_148 + bVar3;
      bVar11 = true;
    }
  }
  *puVar9 = '\x01';
LAB_0051c368:
  local_158 = pbVar5 + 1;
  goto LAB_0051c572;
}

Assistant:

static int loop(const unsigned char *pattern, const unsigned char *string,
                int maxstars)
{
  unsigned char *p = (unsigned char *)pattern;
  unsigned char *s = (unsigned char *)string;
  unsigned char charset[CURLFNM_CHSET_SIZE] = { 0 };

  for(;;) {
    unsigned char *pp;

    switch(*p) {
    case '*':
      if(!maxstars)
        return CURL_FNMATCH_NOMATCH;
      /* Regroup consecutive stars and question marks. This can be done because
         '*?*?*' can be expressed as '??*'. */
      for(;;) {
        if(*++p == '\0')
          return CURL_FNMATCH_MATCH;
        if(*p == '?') {
          if(!*s++)
            return CURL_FNMATCH_NOMATCH;
        }
        else if(*p != '*')
          break;
      }
      /* Skip string characters until we find a match with pattern suffix. */
      for(maxstars--; *s; s++) {
        if(loop(p, s, maxstars) == CURL_FNMATCH_MATCH)
          return CURL_FNMATCH_MATCH;
      }
      return CURL_FNMATCH_NOMATCH;
    case '?':
      if(!*s)
        return CURL_FNMATCH_NOMATCH;
      s++;
      p++;
      break;
    case '\0':
      return *s? CURL_FNMATCH_NOMATCH: CURL_FNMATCH_MATCH;
    case '\\':
      if(p[1])
        p++;
      if(*s++ != *p++)
        return CURL_FNMATCH_NOMATCH;
      break;
    case '[':
      pp = p + 1; /* Copy in case of syntax error in set. */
      if(setcharset(&pp, charset)) {
        int found = FALSE;
        if(!*s)
          return CURL_FNMATCH_NOMATCH;
        if(charset[(unsigned int)*s])
          found = TRUE;
        else if(charset[CURLFNM_ALNUM])
          found = ISALNUM(*s);
        else if(charset[CURLFNM_ALPHA])
          found = ISALPHA(*s);
        else if(charset[CURLFNM_DIGIT])
          found = ISDIGIT(*s);
        else if(charset[CURLFNM_XDIGIT])
          found = ISXDIGIT(*s);
        else if(charset[CURLFNM_PRINT])
          found = ISPRINT(*s);
        else if(charset[CURLFNM_SPACE])
          found = ISSPACE(*s);
        else if(charset[CURLFNM_UPPER])
          found = ISUPPER(*s);
        else if(charset[CURLFNM_LOWER])
          found = ISLOWER(*s);
        else if(charset[CURLFNM_BLANK])
          found = ISBLANK(*s);
        else if(charset[CURLFNM_GRAPH])
          found = ISGRAPH(*s);

        if(charset[CURLFNM_NEGATE])
          found = !found;

        if(!found)
          return CURL_FNMATCH_NOMATCH;
        p = pp + 1;
        s++;
        break;
      }
      /* Syntax error in set; mismatch! */
      return CURL_FNMATCH_NOMATCH;

    default:
      if(*p++ != *s++)
        return CURL_FNMATCH_NOMATCH;
      break;
    }
  }
}